

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_address_set_host_old(ENetAddress *address,char *name)

{
  sockaddr *psVar1;
  addrinfo *paVar2;
  undefined8 uVar3;
  int iVar4;
  addrinfo **__pai;
  addrinfo *resultList;
  addrinfo local_48;
  
  __pai = (addrinfo **)&resultList;
  resultList = (addrinfo *)0x0;
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_socktype = 0;
  local_48.ai_protocol = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  iVar4 = getaddrinfo(name,(char *)0x0,&local_48,__pai);
  if (iVar4 == 0) {
    while (paVar2 = *__pai, paVar2 != (addrinfo *)0x0) {
      psVar1 = paVar2->ai_addr;
      if ((psVar1 != (sockaddr *)0x0) && (0xf < paVar2->ai_addrlen)) {
        if (paVar2->ai_family == 10) {
          uVar3 = *(undefined8 *)(psVar1 + 1);
          *(undefined8 *)&(address->host).__in6_u = *(undefined8 *)(psVar1->sa_data + 6);
          *(undefined8 *)((long)&(address->host).__in6_u + 8) = uVar3;
          address->sin6_scope_id = *(enet_uint16 *)(psVar1[1].sa_data + 6);
LAB_0010762f:
          freeaddrinfo((addrinfo *)resultList);
          return 0;
        }
        if (paVar2->ai_family == 2) {
          *(undefined8 *)&(address->host).__in6_u = 0;
          (address->host).__in6_u.__u6_addr32[2] = 0xffff0000;
          (address->host).__in6_u.__u6_addr32[3] = *(uint32_t *)(psVar1->sa_data + 2);
          goto LAB_0010762f;
        }
      }
      __pai = &paVar2->ai_next;
    }
    freeaddrinfo((addrinfo *)resultList);
    iVar4 = enet_address_set_host_ip_old(address,name);
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int enet_address_set_host_old(ENetAddress *address, const char *name) {
        struct addrinfo hints, *resultList = NULL, *result = NULL;

        memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;

        if (getaddrinfo(name, NULL, &hints, &resultList) != 0) {
            return -1;
        }

        for (result = resultList; result != NULL; result = result->ai_next) {
            if (result->ai_addr != NULL && result->ai_addrlen >= sizeof(struct sockaddr_in)) {
                if (result->ai_family == AF_INET) {
                    struct sockaddr_in * sin = (struct sockaddr_in *) result->ai_addr;

                    ((uint32_t *)&address->host.s6_addr)[0] = 0;
                    ((uint32_t *)&address->host.s6_addr)[1] = 0;
                    ((uint32_t *)&address->host.s6_addr)[2] = htonl(0xffff);
                    ((uint32_t *)&address->host.s6_addr)[3] = sin->sin_addr.s_addr;

                    freeaddrinfo(resultList);
                    return 0;
                }
                else if(result->ai_family == AF_INET6) {
                    struct sockaddr_in6 * sin = (struct sockaddr_in6 *)result->ai_addr;

                    address->host = sin->sin6_addr;
                    address->sin6_scope_id = sin->sin6_scope_id;

                    freeaddrinfo(resultList);
                    return 0;
                }
            }
        }
        freeaddrinfo(resultList);

        return enet_address_set_host_ip(address, name);
    }